

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

NamespaceAliasDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,Identifier *args_1,QualifiedIdentifier *args_2,
          pool_ptr<soul::AST::Expression> *args_3)

{
  PoolItem *pPVar1;
  pool_ptr<soul::AST::Expression> local_40;
  pool_ptr<soul::AST::Expression> local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_40 = (pool_ptr<soul::AST::Expression>)args_3->object;
  local_38.object = &args_2->super_Expression;
  AST::NamespaceAliasDeclaration::NamespaceAliasDeclaration
            ((NamespaceAliasDeclaration *)&pPVar1->item,args,(Identifier)args_1->name,&local_38,
             &local_40);
  pPVar1->destructor =
       allocate<soul::AST::NamespaceAliasDeclaration,_soul::AST::Context_&,_soul::Identifier_&,_soul::AST::QualifiedIdentifier_&,_soul::pool_ptr<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (NamespaceAliasDeclaration *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }